

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cc
# Opt level: O0

clock_constraint_container_t * __thiscall
tchecker::zg::path::concrete::clockval_dbm_t::scale_up
          (clock_constraint_container_t *__return_storage_ptr__,clockval_dbm_t *this,
          clock_constraint_container_t *cc)

{
  bool bVar1;
  integer_t iVar2;
  int local_68;
  ineq_cmp_t local_64;
  clock_id_t local_60 [5];
  clock_id_t local_4c;
  clock_constraint_t *local_48;
  clock_constraint_t *c;
  const_iterator __end3;
  const_iterator __begin3;
  clock_constraint_container_t *__range3;
  clock_constraint_container_t *cc_local;
  clockval_dbm_t *this_local;
  clock_constraint_container_t *scaled_up_cc;
  
  std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::vector
            (__return_storage_ptr__);
  __end3 = std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>
           ::begin(cc);
  c = (clock_constraint_t *)
      std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>::end
                (cc);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end3,(__normal_iterator<const_tchecker::clock_constraint_t_*,_std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>_>
                                     *)&c), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<const_tchecker::clock_constraint_t_*,_std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>_>
               ::operator*(&__end3);
    local_4c = clock_constraint_t::id1(local_48);
    local_60[0] = clock_constraint_t::id2(local_48);
    local_64 = clock_constraint_t::comparator(local_48);
    iVar2 = clock_constraint_t::value(local_48);
    local_68 = iVar2 * this->_denominator;
    std::vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>>::
    emplace_back<unsigned_int,unsigned_int,tchecker::ineq_cmp_t,int>
              ((vector<tchecker::clock_constraint_t,std::allocator<tchecker::clock_constraint_t>> *)
               __return_storage_ptr__,&local_4c,local_60,&local_64,&local_68);
    __gnu_cxx::
    __normal_iterator<const_tchecker::clock_constraint_t_*,_std::vector<tchecker::clock_constraint_t,_std::allocator<tchecker::clock_constraint_t>_>_>
    ::operator++(&__end3);
  }
  return __return_storage_ptr__;
}

Assistant:

tchecker::clock_constraint_container_t scale_up(tchecker::clock_constraint_container_t const & cc) const
  {
    tchecker::clock_constraint_container_t scaled_up_cc;
    for (tchecker::clock_constraint_t const & c : cc)
      scaled_up_cc.emplace_back(c.id1(), c.id2(), c.comparator(), c.value() * _denominator);
    return scaled_up_cc;
  }